

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall
AbstractModuleClient::AbstractModuleClient(AbstractModuleClient *this,char *id,char *addr,int port)

{
  bool bVar1;
  AbstractModuleClient *in_RSI;
  MlmWrap *in_RDI;
  int in_stack_0000009c;
  char *in_stack_000000a0;
  char *in_stack_000000a8;
  MlmWrap *in_stack_000000b0;
  
  MlmWrap::MlmWrap(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009c);
  in_RDI->_vptr_MlmWrap = (_func_int **)&PTR__AbstractModuleClient_005d5d40;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x32f3c7);
  in_RDI[1].client = (mlm_client_t *)0x0;
  std::__cxx11::string::string((string *)&in_RDI[1].reactor);
  *(undefined4 *)&in_RDI[1].hardwaresock = 0;
  *(undefined8 *)&in_RDI[1].trackers._M_t._M_impl = 0;
  std::mutex::mutex((mutex *)0x32f40e);
  bVar1 = MlmWrap::isConnectedToBroker(in_RDI);
  if (bVar1) {
    initializeStreams(in_RSI);
  }
  return;
}

Assistant:

AbstractModuleClient::AbstractModuleClient(const char* id, const char* addr, int port)
    : MlmWrap(id, addr, port),timestampsub(NULL) {
    if (isConnectedToBroker()) {
        initializeStreams();
    }
}